

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

int RunVar(undefined8 param_1,short param_2,undefined8 param_3,Commandline *param_4)

{
  size_type __n;
  char *pcVar1;
  short sVar2;
  int iVar3;
  uint uVar4;
  char *__s;
  const_iterator cVar5;
  ostream *poVar6;
  size_t sVar7;
  ulong uVar8;
  char *pcVar9;
  long lVar10;
  initializer_list<bhf::ParameterOption> list;
  initializer_list<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>
  __l;
  uint32_t bytesRead;
  vector<unsigned_char,_std::allocator<unsigned_char>_> readBuffer;
  AdsHandle handle;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> type;
  AdsDevice device;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> name;
  stringstream stream;
  ParameterList params;
  allocator_type local_34e;
  less<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_34d;
  int local_34c;
  int local_348;
  undefined4 uStack_344;
  undefined1 local_338 [16];
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_328;
  undefined8 local_310;
  AdsHandle local_308;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2e0;
  unique_ptr<const_AmsNetId,_ResourceDeleter<const_AmsNetId>_> local_2c0;
  unique_ptr<const_long,_ResourceDeleter<const_long>_> local_290;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_268;
  undefined1 local_248 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_238;
  _Alloc_hider local_228;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
  local_220;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
  local_1f8;
  undefined1 local_1d0 [40];
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
  local_1a8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
  local_180 [4];
  string local_c0;
  string local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bhf::ParameterOption>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bhf::ParameterOption>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bhf::ParameterOption>_>_>
  local_60;
  
  local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"--type","");
  local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"");
  bhf::ParameterOption::ParameterOption((ParameterOption *)local_248,&local_a0,false,&local_c0);
  list._M_len = 1;
  list._M_array = (iterator)local_248;
  bhf::ParameterList::ParameterList((ParameterList *)&local_60,list);
  local_310 = param_1;
  if ((size_type *)local_228._M_p != &local_220.first._M_string_length) {
    operator_delete(local_228._M_p);
  }
  pcVar9 = local_248 + 0x10;
  if ((char *)local_248._0_8_ != pcVar9) {
    operator_delete((void *)local_248._0_8_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
    operator_delete(local_c0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
    operator_delete(local_a0._M_dataplus._M_p);
  }
  bhf::Commandline::Parse((ParameterList *)param_4);
  local_248._0_8_ = pcVar9;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_248,"Variable name is missing","")
  ;
  bhf::Commandline::Pop<std::__cxx11::string>(&local_268,param_4,(string *)local_248);
  if ((char *)local_248._0_8_ != pcVar9) {
    operator_delete((void *)local_248._0_8_);
  }
  local_248._8_8_ = (pointer)0x0;
  local_238._M_local_buf[0] = '\0';
  local_248._0_8_ = pcVar9;
  __s = bhf::Commandline::Pop<char_const*>((string *)param_4);
  if ((char *)local_248._0_8_ != pcVar9) {
    operator_delete((void *)local_248._0_8_);
  }
  if ((RunVar(AmsNetId,unsigned_short,std::__cxx11::string_const&,bhf::Commandline&)::
       typeMap_abi_cxx11_ == '\0') &&
     (iVar3 = __cxa_guard_acquire(&RunVar(AmsNetId,unsigned_short,std::__cxx11::string_const&,bhf::Commandline&)
                                   ::typeMap_abi_cxx11_), iVar3 != 0)) {
    local_2c0._M_t.super___uniq_ptr_impl<const_AmsNetId,_ResourceDeleter<const_AmsNetId>_>._M_t.
    super__Tuple_impl<0UL,_const_AmsNetId_*,_ResourceDeleter<const_AmsNetId>_>.
    super__Tuple_impl<1UL,_ResourceDeleter<const_AmsNetId>_>.
    super__Head_base<1UL,_ResourceDeleter<const_AmsNetId>,_false>._M_head_impl =
         (ResourceDeleter<const_AmsNetId>)0x1;
    local_2c0._M_t.super___uniq_ptr_impl<const_AmsNetId,_ResourceDeleter<const_AmsNetId>_>._M_t.
    super__Tuple_impl<0UL,_const_AmsNetId_*,_ResourceDeleter<const_AmsNetId>_>.
    super__Tuple_impl<1UL,_ResourceDeleter<const_AmsNetId>_>.
    super__Head_base<1UL,_ResourceDeleter<const_AmsNetId>,_false>._1_3_ = 0;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
    ::pair<const_char_(&)[5],_int,_true>
              ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
                *)local_248,(char (*) [5])"BOOL",(int *)&local_2c0);
    local_308._M_t.super___uniq_ptr_impl<unsigned_int,_ResourceDeleter<unsigned_int>_>._M_t.
    super__Tuple_impl<0UL,_unsigned_int_*,_ResourceDeleter<unsigned_int>_>.
    super__Tuple_impl<1UL,_ResourceDeleter<unsigned_int>_>.
    super__Head_base<1UL,_ResourceDeleter<unsigned_int>,_false>._M_head_impl =
         (ResourceDeleter<unsigned_int>)0x1;
    local_308._M_t.super___uniq_ptr_impl<unsigned_int,_ResourceDeleter<unsigned_int>_>._M_t.
    super__Tuple_impl<0UL,_unsigned_int_*,_ResourceDeleter<unsigned_int>_>.
    super__Tuple_impl<1UL,_ResourceDeleter<unsigned_int>_>.
    super__Head_base<1UL,_ResourceDeleter<unsigned_int>,_false>._1_3_ = 0;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
    ::pair<const_char_(&)[5],_int,_true>
              ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
                *)(local_248 + 0x28),(char (*) [5])"BYTE",(int *)&local_308);
    local_2e0._M_dataplus._M_p._0_4_ = 2;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
    ::pair<const_char_(&)[5],_int,_true>(&local_1f8,(char (*) [5])0x10f593,(int *)&local_2e0);
    local_348 = 4;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
    ::pair<const_char_(&)[6],_int,_true>
              ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
                *)local_1d0,(char (*) [6])"DWORD",&local_348);
    local_328.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start._0_4_ = 8;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
    ::pair<const_char_(&)[6],_int,_true>(&local_1a8,(char (*) [6])"LWORD",(int *)&local_328);
    local_34c = 0xff;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
    ::pair<const_char_(&)[7],_int,_true>(local_180,(char (*) [7])"STRING",&local_34c);
    __l._M_len = 6;
    __l._M_array = (iterator)local_248;
    std::
    map<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
    ::map(&RunVar(AmsNetId,unsigned_short,std::__cxx11::string_const&,bhf::Commandline&)::
           typeMap_abi_cxx11_,__l,&local_34d,&local_34e);
    lVar10 = 0;
    do {
      pcVar1 = *(char **)((long)&local_180[0].first._M_dataplus._M_p + lVar10);
      if (local_180[0].first.field_2._M_local_buf + lVar10 != pcVar1) {
        operator_delete(pcVar1);
      }
      lVar10 = lVar10 + -0x28;
    } while (lVar10 != -0xf0);
    __cxa_atexit(std::
                 map<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                 ::~map,&RunVar(AmsNetId,unsigned_short,std::__cxx11::string_const&,bhf::Commandline&)
                         ::typeMap_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&RunVar(AmsNetId,unsigned_short,std::__cxx11::string_const&,bhf::Commandline&)
                         ::typeMap_abi_cxx11_);
  }
  local_248._0_8_ = pcVar9;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_248,"--type","");
  local_80._M_string_length = 0;
  local_80.field_2._M_local_buf[0] = '\0';
  local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
  bhf::ParameterList::Get<std::__cxx11::string>
            (&local_2e0,(ParameterList *)&local_60,(string *)local_248,&local_80);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != &local_80.field_2) {
    operator_delete(local_80._M_dataplus._M_p);
  }
  if ((char *)local_248._0_8_ != pcVar9) {
    operator_delete((void *)local_248._0_8_);
  }
  cVar5 = std::
          _Rb_tree<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::less<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
          ::find(&RunVar(AmsNetId,unsigned_short,std::__cxx11::string_const&,bhf::Commandline&)::
                  typeMap_abi_cxx11_._M_t,&local_2e0);
  if ((_Rb_tree_header *)cVar5._M_node ==
      &RunVar(AmsNetId,unsigned_short,std::__cxx11::string_const&,bhf::Commandline&)::
       typeMap_abi_cxx11_._M_t._M_impl.super__Rb_tree_header) {
    std::__cxx11::stringstream::stringstream((stringstream *)local_248);
    poVar6 = (ostream *)(local_248 + 0x10);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"RunVar",6);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"(): Unknown TwinCAT type \'",0x1a);
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar6,(char *)CONCAT44(local_2e0._M_dataplus._M_p._4_4_,
                                                local_2e0._M_dataplus._M_p._0_4_),
                        local_2e0._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\'\n",2);
    std::__cxx11::stringbuf::str();
    Logger::Log(3,(string *)&local_2c0);
    if ((void *)CONCAT44(local_2c0._M_t.
                         super___uniq_ptr_impl<const_AmsNetId,_ResourceDeleter<const_AmsNetId>_>.
                         _M_t.
                         super__Tuple_impl<0UL,_const_AmsNetId_*,_ResourceDeleter<const_AmsNetId>_>.
                         super__Tuple_impl<1UL,_ResourceDeleter<const_AmsNetId>_>.
                         super__Head_base<1UL,_ResourceDeleter<const_AmsNetId>,_false>._4_4_,
                         local_2c0._M_t.
                         super___uniq_ptr_impl<const_AmsNetId,_ResourceDeleter<const_AmsNetId>_>.
                         _M_t.
                         super__Tuple_impl<0UL,_const_AmsNetId_*,_ResourceDeleter<const_AmsNetId>_>.
                         super__Tuple_impl<1UL,_ResourceDeleter<const_AmsNetId>_>.
                         super__Head_base<1UL,_ResourceDeleter<const_AmsNetId>,_false>._0_4_) !=
        (void *)((long)&local_2c0._M_t.
                        super___uniq_ptr_impl<const_AmsNetId,_ResourceDeleter<const_AmsNetId>_>._M_t
                        .super__Tuple_impl<0UL,_const_AmsNetId_*,_ResourceDeleter<const_AmsNetId>_>.
                        super__Tuple_impl<1UL,_ResourceDeleter<const_AmsNetId>_> + 0x10U)) {
      operator_delete((void *)CONCAT44(local_2c0._M_t.
                                       super___uniq_ptr_impl<const_AmsNetId,_ResourceDeleter<const_AmsNetId>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_const_AmsNetId_*,_ResourceDeleter<const_AmsNetId>_>
                                       .super__Tuple_impl<1UL,_ResourceDeleter<const_AmsNetId>_>.
                                       super__Head_base<1UL,_ResourceDeleter<const_AmsNetId>,_false>
                                       ._4_4_,local_2c0._M_t.
                                              super___uniq_ptr_impl<const_AmsNetId,_ResourceDeleter<const_AmsNetId>_>
                                              ._M_t.
                                              super__Tuple_impl<0UL,_const_AmsNetId_*,_ResourceDeleter<const_AmsNetId>_>
                                              .
                                              super__Tuple_impl<1UL,_ResourceDeleter<const_AmsNetId>_>
                                              .
                                              super__Head_base<1UL,_ResourceDeleter<const_AmsNetId>,_false>
                                              ._0_4_));
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_248);
    std::ios_base::~ios_base((ios_base *)(local_1d0 + 8));
    iVar3 = -1;
    goto LAB_00108fb0;
  }
  __n = *(size_type *)(cVar5._M_node + 2);
  sVar2 = 0x353;
  if (param_2 != 0) {
    sVar2 = param_2;
  }
  AdsDevice::AdsDevice((AdsDevice *)&local_2c0,param_3,local_310,sVar2);
  AdsDevice::GetHandle((string *)&local_308);
  if (__s == (char *)0x0) {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              (&local_328,__n,(allocator_type *)local_248);
    local_34c = 0;
    uVar8 = AdsDevice::ReadReqEx2
                      ((uint)&local_2c0,0xf005,
                       (ulong)*local_308._M_t.
                               super___uniq_ptr_impl<unsigned_int,_ResourceDeleter<unsigned_int>_>.
                               _M_t.
                               super__Tuple_impl<0UL,_unsigned_int_*,_ResourceDeleter<unsigned_int>_>
                               .super__Head_base<0UL,_unsigned_int_*,_false>._M_head_impl,
                       local_328.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_finish +
                       -(long)CONCAT44(local_328.
                                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                       ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                       local_328.
                                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                       ._M_impl.super__Vector_impl_data._M_start._0_4_),
                       (uint *)CONCAT44(local_328.
                                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                        ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                        local_328.
                                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                        ._M_impl.super__Vector_impl_data._M_start._0_4_));
    if (uVar8 == 0) {
      switch(local_34c) {
      case 1:
        uVar4 = PrintAs<unsigned_char>(&local_328);
        break;
      case 2:
        uVar4 = PrintAs<unsigned_short>(&local_328);
        break;
      default:
        std::ostream::write((char *)&std::cout,
                            CONCAT44(local_328.
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                     local_328.
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     ._M_impl.super__Vector_impl_data._M_start._0_4_));
        uVar8 = (ulong)(*(int *)(std::__cxx11::string::rfind + *(long *)(std::cout + -0x18)) != 0);
        goto LAB_00108f7d;
      case 4:
        uVar4 = PrintAs<unsigned_int>(&local_328);
        break;
      case 8:
        uVar4 = PrintAs<unsigned_long>(&local_328);
      }
      uVar8 = (ulong)uVar4;
    }
    else {
      std::__cxx11::stringstream::stringstream((stringstream *)local_248);
      poVar6 = (ostream *)(local_248 + 0x10);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"RunVar",6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"(): failed with: 0x",0x13);
      lVar10 = *(long *)(CONCAT71(local_238._M_allocated_capacity._1_7_,local_238._M_local_buf[0]) +
                        -0x18);
      *(uint *)(local_248 + lVar10 + 0x28) = *(uint *)(local_248 + lVar10 + 0x28) & 0xffffffb5 | 8;
      poVar6 = std::ostream::_M_insert<long>((long)poVar6);
      local_348 = CONCAT31(local_348._1_3_,10);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,(char *)&local_348,1);
      std::__cxx11::stringbuf::str();
      Logger::Log(3,(string *)&local_348);
      if ((undefined1 *)CONCAT44(uStack_344,local_348) != local_338) {
        operator_delete((undefined1 *)CONCAT44(uStack_344,local_348));
      }
      std::__cxx11::stringstream::~stringstream((stringstream *)local_248);
      std::ios_base::~ios_base((ios_base *)(local_1d0 + 8));
    }
LAB_00108f7d:
    iVar3 = (int)uVar8;
    pcVar9 = (char *)CONCAT44(local_328.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start._4_4_,
                              local_328.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start._0_4_);
LAB_00108f82:
    if (pcVar9 != (char *)0x0) {
      operator_delete(pcVar9);
    }
  }
  else {
    std::__cxx11::stringstream::stringstream((stringstream *)local_248);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)(local_248 + 0x10),"name>",5);
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)(local_248 + 0x10),local_268._M_dataplus._M_p,
                        local_268._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"< value>",8);
    sVar7 = strlen(__s);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,__s,sVar7);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"<\n",2);
    std::__cxx11::stringbuf::str();
    Logger::Log(0,(string *)&local_348);
    if ((undefined1 *)CONCAT44(uStack_344,local_348) != local_338) {
      operator_delete((undefined1 *)CONCAT44(uStack_344,local_348));
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_248);
    std::ios_base::~ios_base((ios_base *)(local_1d0 + 8));
    std::__cxx11::stringstream::stringstream((stringstream *)local_248);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)(local_248 + 0x10),"size>",5);
    poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)(local_248 + 0x10));
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"< value>",8);
    sVar7 = strlen(__s);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,__s,sVar7);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"<\n",2);
    std::__cxx11::stringbuf::str();
    Logger::Log(0,(string *)&local_348);
    if ((undefined1 *)CONCAT44(uStack_344,local_348) != local_338) {
      operator_delete((undefined1 *)CONCAT44(uStack_344,local_348));
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_248);
    std::ios_base::~ios_base((ios_base *)(local_1d0 + 8));
    switch(__n) {
    case 1:
      iVar3 = Write<unsigned_char>((AdsDevice *)&local_2c0,&local_308,__s);
      break;
    case 2:
      iVar3 = Write<unsigned_short>((AdsDevice *)&local_2c0,&local_308,__s);
      break;
    default:
      std::vector<char,_std::allocator<char>_>::vector
                ((vector<char,_std::allocator<char>_> *)local_248,__n,(allocator_type *)&local_348);
      strncpy((char *)local_248._0_8_,__s,local_248._8_8_ - local_248._0_8_);
      iVar3 = AdsDevice::WriteReqEx
                        ((uint)&local_2c0,0xf005,
                         (ulong)*local_308._M_t.
                                 super___uniq_ptr_impl<unsigned_int,_ResourceDeleter<unsigned_int>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_unsigned_int_*,_ResourceDeleter<unsigned_int>_>
                                 .super__Head_base<0UL,_unsigned_int_*,_false>._M_head_impl,
                         (pointer)(local_248._8_8_ + -local_248._0_8_));
      pcVar9 = (char *)local_248._0_8_;
      goto LAB_00108f82;
    case 4:
      iVar3 = Write<unsigned_int>((AdsDevice *)&local_2c0,&local_308,__s);
      break;
    case 8:
      iVar3 = Write<unsigned_long>((AdsDevice *)&local_2c0,&local_308,__s);
    }
  }
  std::unique_ptr<unsigned_int,_ResourceDeleter<unsigned_int>_>::~unique_ptr(&local_308);
  std::unique_ptr<const_long,_ResourceDeleter<const_long>_>::~unique_ptr(&local_290);
  std::unique_ptr<const_AmsNetId,_ResourceDeleter<const_AmsNetId>_>::~unique_ptr(&local_2c0);
LAB_00108fb0:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT44(local_2e0._M_dataplus._M_p._4_4_,local_2e0._M_dataplus._M_p._0_4_) !=
      &local_2e0.field_2) {
    operator_delete((undefined1 *)
                    CONCAT44(local_2e0._M_dataplus._M_p._4_4_,local_2e0._M_dataplus._M_p._0_4_));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_268._M_dataplus._M_p != &local_268.field_2) {
    operator_delete(local_268._M_dataplus._M_p);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bhf::ParameterOption>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bhf::ParameterOption>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bhf::ParameterOption>_>_>
  ::~_Rb_tree(&local_60);
  return iVar3;
}

Assistant:

int RunVar(const AmsNetId netid, const uint16_t port, const std::string& gw, bhf::Commandline& args)
{
    bhf::ParameterList params = {
        {"--type"},
    };
    args.Parse(params);

    const auto name = args.Pop<std::string>("Variable name is missing");
    const auto value = args.Pop<const char*>();
    static const std::map<const std::string, size_t> typeMap = {
        {"BOOL", 1},
        {"BYTE", 1},
        {"WORD", 2},
        {"DWORD", 4},
        {"LWORD", 8},
        {"STRING", 255},
    };
    const auto type = params.Get<std::string>("--type");
    const auto it = typeMap.find(type);
    if (typeMap.end() == it) {
        LOG_ERROR(__FUNCTION__ << "(): Unknown TwinCAT type '" << type << "'\n");
        return -1;
    }
    const auto size = it->second;

    auto device = AdsDevice { gw, netid, port ? port : uint16_t(AMSPORT_R0_PLC_TC3) };
    const auto handle = device.GetHandle(name);

    if (!value) {
        std::vector<uint8_t> readBuffer(size);
        uint32_t bytesRead = 0;
        const auto status = device.ReadReqEx2(ADSIGRP_SYM_VALBYHND,
                                              *handle,
                                              readBuffer.size(),
                                              readBuffer.data(),
                                              &bytesRead);
        if (ADSERR_NOERR != status) {
            LOG_ERROR(__FUNCTION__ << "(): failed with: 0x" << std::hex << status << '\n');
            return status;
        }

        switch (bytesRead) {
        case sizeof(uint8_t):
            return PrintAs<uint8_t>(readBuffer);

        case sizeof(uint16_t):
            return PrintAs<uint16_t>(readBuffer);

        case sizeof(uint32_t):
            return PrintAs<uint32_t>(readBuffer);

        case sizeof(uint64_t):
            return PrintAs<uint64_t>(readBuffer);

        default:
            bhf::ForceBinaryOutputOnWindows();
            std::cout.write((const char*)readBuffer.data(), bytesRead);
            return !std::cout.good();
        }
    }

    LOG_VERBOSE("name>" << name << "< value>" << value << "<\n");
    LOG_VERBOSE("size>" << size << "< value>" << value << "<\n");

    switch (size) {
    case sizeof(uint8_t):
        return Write<uint8_t>(device, handle, value);

    case sizeof(uint16_t):
        return Write<uint16_t>(device, handle, value);

    case sizeof(uint32_t):
        return Write<uint32_t>(device, handle, value);

    case sizeof(uint64_t):
        return Write<uint64_t>(device, handle, value);

    default:
        {
            auto writeBuffer = std::vector<char>(size);
            strncpy(writeBuffer.data(), value, writeBuffer.size());
            return device.WriteReqEx(ADSIGRP_SYM_VALBYHND,
                                     *handle,
                                     writeBuffer.size(),
                                     writeBuffer.data());
        }
    }
}